

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qsbr.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2051f::QSBR_ReacquireLivePtrAfterQuiescentState_Test::TestBody
          (QSBR_ReacquireLivePtrAfterQuiescentState_Test *this)

{
  qsbr_epoch qVar1;
  char *lhs;
  qsbr_per_thread *pqVar2;
  _Tuple_impl<0UL,_unodb::detail::dealloc_vector_list_node_*,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  _Var3;
  _Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false> _Var4;
  qsbr *this_00;
  qsbr_thread *__stat_loc;
  char *message;
  undefined1 auVar5 [16];
  long local_58;
  long local_50;
  qsbr_thread second_thread;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  _Head_base<0UL,_unodb::qsbr_per_thread_*,_false> local_38;
  _Head_base<0UL,_unodb::qsbr_per_thread_*,_false> local_30;
  
  unodb::test::QSBRTestBase::mark_epoch(&this->super_QSBR);
  lhs = (char *)unodb::test::QSBRTestBase::allocate();
  *lhs = 'A';
  pqVar2 = (qsbr_per_thread *)operator_new(0x98);
  _Var3.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl =
       (_Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>)operator_new(0x20);
  *(undefined8 *)
   _Var3.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)_Var3.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl
   + 8) = 0;
  *(undefined8 *)
   ((long)_Var3.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl
   + 0x10) = 0;
  *(undefined8 *)
   ((long)_Var3.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl
   + 0x18) = 0;
  (pqVar2->previous_interval_orphan_list_node)._M_t.
  super___uniq_ptr_impl<unodb::detail::dealloc_vector_list_node,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::dealloc_vector_list_node_*,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  .super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false> =
       _Var3.super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl;
  _Var4._M_head_impl = (dealloc_vector_list_node *)operator_new(0x20);
  *(undefined8 *)&(_Var4._M_head_impl)->requests = 0;
  *(pointer *)((long)&(_Var4._M_head_impl)->requests + 8) = (pointer)0x0;
  *(pointer *)((long)&(_Var4._M_head_impl)->requests + 0x10) = (pointer)0x0;
  (_Var4._M_head_impl)->next = (dealloc_vector_list_node *)0x0;
  (pqVar2->current_interval_orphan_list_node)._M_t.
  super___uniq_ptr_impl<unodb::detail::dealloc_vector_list_node,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::dealloc_vector_list_node_*,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
  .super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>._M_head_impl =
       _Var4._M_head_impl;
  pqVar2->quiescent_states_since_epoch_change = 0;
  this_00 = unodb::qsbr::instance();
  qVar1 = unodb::qsbr::register_thread(this_00);
  (pqVar2->last_seen_quiescent_state_epoch).epoch_val = qVar1.epoch_val;
  (pqVar2->last_seen_epoch).epoch_val = qVar1.epoch_val;
  pqVar2->current_interval_total_dealloc_size = 0;
  (pqVar2->previous_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pqVar2->previous_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pqVar2->previous_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pqVar2->current_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(pqVar2->previous_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)
   ((long)&(pqVar2->current_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) = 0;
  *(undefined8 *)
   ((long)&(pqVar2->current_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(pqVar2->current_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (pqVar2->active_ptrs)._M_h._M_buckets = &(pqVar2->active_ptrs)._M_h._M_single_bucket;
  (pqVar2->active_ptrs)._M_h._M_bucket_count = 1;
  auVar5 = ZEXT416(0) << 0x40;
  (pqVar2->active_ptrs)._M_h._M_before_begin = (__node_base)auVar5._0_8_;
  (pqVar2->active_ptrs)._M_h._M_element_count = auVar5._8_8_;
  (pqVar2->active_ptrs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(pqVar2->active_ptrs)._M_h._M_rehash_policy._M_next_resize = auVar5;
  local_38._M_head_impl = (qsbr_per_thread *)0x0;
  local_58 = 0;
  local_30._M_head_impl = pqVar2;
  second_thread.super_thread._M_id._M_thread = (thread)operator_new(0x18);
  *(undefined ***)second_thread.super_thread._M_id._M_thread = &PTR___State_impl_001777e8;
  *(char **)((long)second_thread.super_thread._M_id._M_thread + 8) = lhs;
  *(qsbr_per_thread **)((long)second_thread.super_thread._M_id._M_thread + 0x10) = pqVar2;
  local_30._M_head_impl = (qsbr_per_thread *)0x0;
  __stat_loc = &second_thread;
  std::thread::_M_start_thread(&local_58,__stat_loc,0);
  if (second_thread.super_thread._M_id._M_thread != (id)0x0) {
    (**(code **)(*(long *)second_thread.super_thread._M_id._M_thread + 8))();
  }
  std::unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::~unique_ptr
            ((unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *)
             &local_30);
  std::unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::~unique_ptr
            ((unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *)
             &local_38);
  local_50 = local_58;
  unodb::detail::thread_sync::wait((thread_sync *)unodb::detail::thread_syncs,__stat_loc);
  unodb::test::QSBRTestBase::quiescent();
  unodb::test::QSBRTestBase::check_epoch_same(&this->super_QSBR);
  unodb::detail::qsbr_ptr_base::register_active_ptr(lhs);
  unodb::detail::thread_sync::notify((thread_sync *)(unodb::detail::thread_syncs + 0x60));
  unodb::detail::thread_sync::wait((thread_sync *)unodb::detail::thread_syncs,__stat_loc);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  std::thread::join();
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  unodb::test::allocation_failure_injector::allocation_counter.super___atomic_base<unsigned_long>.
  _M_i = (__atomic_base<unsigned_long>)0;
  unodb::test::QSBRTestBase::check_epoch_advanced(&this->super_QSBR);
  local_38._M_head_impl._0_1_ = 0x41;
  testing::internal::CmpHelperEQ<char,char>
            ((internal *)&second_thread,"(*active_ptr)","(\'A\')",lhs,(char *)&local_38);
  if ((char)second_thread.super_thread._M_id._M_thread == '\0') {
    testing::Message::Message((Message *)&local_38);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_qsbr.cpp"
               ,0x340,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
    if (local_38._M_head_impl != (qsbr_per_thread *)0x0) {
      (*(code *)*(pointer *)
                 ((long)&(((local_38._M_head_impl)->previous_interval_orphan_list_node)._M_t.
                          super___uniq_ptr_impl<unodb::detail::dealloc_vector_list_node,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unodb::detail::dealloc_vector_list_node_*,_std::default_delete<unodb::detail::dealloc_vector_list_node>_>
                          .super__Head_base<0UL,_unodb::detail::dealloc_vector_list_node_*,_false>.
                         _M_head_impl)->requests + 8))();
    }
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40);
    }
    unodb::detail::qsbr_ptr_base::unregister_active_ptr(lhs);
  }
  else {
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40);
    }
    unodb::detail::qsbr_ptr_base::unregister_active_ptr(lhs);
    unodb::test::QSBRTestBase::quiescent();
    unodb::test::QSBRTestBase::check_epoch_advanced(&this->super_QSBR);
  }
  if (local_50 == 0) {
    return;
  }
  std::terminate();
}

Assistant:

UNODB_TEST_F(QSBR, ReacquireLivePtrAfterQuiescentState) {
  mark_epoch();
  auto *const ptr = static_cast<char *>(allocate());
  touch_memory(ptr, 'A');

  unodb::qsbr_thread second_thread{[ptr] {
    thread_syncs[0].notify();  // 1 ->
    thread_syncs[1].wait();    // 2 <-

    qsbr_deallocate(ptr);

    thread_syncs[0].notify();  // 3 ->
  }};

  thread_syncs[0].wait();  // 1 <-

  // Wrote ptr to a shared data structure and done with it for now
  quiescent();

  check_epoch_same();

  {
    // Reacquired ptr from a shared data structure
    const unodb::qsbr_ptr<char> active_ptr{ptr};

    thread_syncs[1].notify();  // 2 ->
    thread_syncs[0].wait();    // 3 <-

    join(second_thread);

    check_epoch_advanced();

    UNODB_ASSERT_EQ(*active_ptr, 'A');
  }

  quiescent();

  check_epoch_advanced();
}